

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O2

void cilk_fiber_tbb_interop_save_info_from_stack(cilk_fiber *fiber)

{
  void *pvVar1;
  __cilk_tbb_stack_op_thunk *t;
  
  if ((fiber != (cilk_fiber *)0x0) &&
     ((fiber->super_cilk_fiber_data).stack_op_routine != (__cilk_tbb_pfn_stack_op)0x0)) {
    t = __cilkrts_get_tls_tbb_interop();
    if (t == (__cilk_tbb_stack_op_thunk *)0x0) {
      t = (__cilk_tbb_stack_op_thunk *)__cilkrts_malloc(0x10);
      __cilkrts_set_tls_tbb_interop(t);
    }
    pvVar1 = (fiber->super_cilk_fiber_data).stack_op_data;
    t->routine = (fiber->super_cilk_fiber_data).stack_op_routine;
    t->data = pvVar1;
  }
  return;
}

Assistant:

void cilk_fiber_tbb_interop_save_info_from_stack(cilk_fiber *fiber)
{
    __cilk_tbb_stack_op_thunk *saved_thunk;
    cilk_fiber_data* fdata;

    if (NULL == fiber)
        return;

    fdata = cilk_fiber_get_data(fiber);
    // If there is no TBB interop data, just return
    if (NULL == fdata->stack_op_routine)
        return;
    
    saved_thunk = __cilkrts_get_tls_tbb_interop();

    // If there is not already space allocated, allocate some.
    if (NULL == saved_thunk) {
        saved_thunk = (__cilk_tbb_stack_op_thunk*)
            __cilkrts_malloc(sizeof(__cilk_tbb_stack_op_thunk));
        __cilkrts_set_tls_tbb_interop(saved_thunk);
    }

    saved_thunk->routine = fdata->stack_op_routine;
    saved_thunk->data = fdata->stack_op_data;
}